

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.cpp
# Opt level: O2

compile_errcode __thiscall
SymbolTable::GetArraySpace(SymbolTable *this,string *name,int *array_space)

{
  compile_errcode cVar1;
  SymbolTableTerm term;
  SymbolTableTerm local_48;
  
  local_48.m_name._M_dataplus._M_p = (pointer)&local_48.m_name.field_2;
  local_48.m_name._M_string_length = 0;
  local_48.m_name.field_2._M_local_buf[0] = '\0';
  cVar1 = GetTerm(this,name,&local_48);
  if (cVar1 == 0) {
    *array_space = (int)local_48.m_other_information;
  }
  std::__cxx11::string::~string((string *)&local_48);
  return cVar1;
}

Assistant:

compile_errcode SymbolTable::GetArraySpace(const string& name, int& array_space) const {
    int ret = COMPILE_OK;
    SymbolTableTerm term;
    if ((ret = this->GetTerm(name, term)) != COMPILE_OK) {
        return ret;
    } else {
        array_space = term.GetArrayInformation();
        return COMPILE_OK;
    }
}